

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTPNCallBase::fold_constants(CTPNCallBase *this,CTcPrsSymtab *symtab)

{
  _func_int **pp_Var1;
  undefined8 in_RSI;
  CTcPrsNode *in_RDI;
  
  pp_Var1 = in_RDI[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
  pp_Var1 = (_func_int **)(**(code **)(*pp_Var1 + 0x78))(pp_Var1,in_RSI);
  in_RDI[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var1;
  pp_Var1 = in_RDI[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
  (**(code **)(*pp_Var1 + 0x78))(pp_Var1,in_RSI);
  return in_RDI;
}

Assistant:

CTcPrsNode *CTPNCallBase::fold_constants(CTcPrsSymtab *symtab)
{
    /* fold my function expression */
    func_ = func_->fold_constants(symtab);

    /* fold my argument list */
    arglist_->fold_constants(symtab);

    /* return myself unchanged */
    return this;
}